

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O0

void Ssc_GiaSimRound(Gia_Man_t *p)

{
  word wVar1;
  word wVar2;
  int nWords_00;
  int iVar3;
  int iVar4;
  word *pwVar5;
  bool bVar6;
  int local_34;
  int nWords;
  int i;
  word *pSim1;
  word *pSim0;
  word *pSim;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  nWords_00 = Gia_ObjSimWords(p);
  Ssc_GiaResetSimInfo(p);
  iVar3 = Vec_WrdSize(p->vSims);
  iVar4 = Gia_ManObjNum(p);
  if (nWords_00 != iVar3 / iVar4) {
    __assert_fail("nWords == Vec_WrdSize(p->vSims) / Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                  ,0xfd,"void Ssc_GiaSimRound(Gia_Man_t *)");
  }
  pwVar5 = Gia_ObjSim(p,0);
  Ssc_SimConst(pwVar5,nWords_00,0);
  pSim0 = Gia_ObjSim(p,1);
  pSim1 = Gia_ObjSimPi(p,0);
  local_34 = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (local_34 < iVar3) {
      pSim = (word *)Gia_ManCi(p,local_34);
      bVar6 = (Gia_Obj_t *)pSim != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pwVar5 = Gia_ObjSimObj(p,(Gia_Obj_t *)pSim);
    if (pSim0 != pwVar5) {
      __assert_fail("pSim == Gia_ObjSimObj( p, pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                    ,0x105,"void Ssc_GiaSimRound(Gia_Man_t *)");
    }
    Ssc_SimDup(pSim0,pSim1,nWords_00,0);
    pSim0 = pSim0 + nWords_00;
    pSim1 = pSim1 + nWords_00;
    local_34 = local_34 + 1;
  }
  iVar3 = Gia_ManCiNum(p);
  pSim0 = Gia_ObjSim(p,iVar3 + 1);
  local_34 = 0;
  while( true ) {
    bVar6 = false;
    if (local_34 < p->nObjs) {
      pSim = (word *)Gia_ManObj(p,local_34);
      bVar6 = (Gia_Obj_t *)pSim != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar3 = Gia_ObjIsAnd((Gia_Obj_t *)pSim);
    if (iVar3 != 0) {
      pwVar5 = Gia_ObjSim(p,local_34);
      if (pSim0 != pwVar5) {
        __assert_fail("pSim == Gia_ObjSim( p, i )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                      ,0x10e,"void Ssc_GiaSimRound(Gia_Man_t *)");
      }
      wVar2 = *pSim;
      wVar1 = *pSim;
      iVar3 = Gia_ObjFaninC0((Gia_Obj_t *)pSim);
      iVar4 = Gia_ObjFaninC1((Gia_Obj_t *)pSim);
      Ssc_SimAnd(pSim0,pSim0 + -(long)(int)(((uint)wVar2 & 0x1fffffff) * nWords_00),
                 pSim0 + -(long)(int)(((uint)(wVar1 >> 0x20) & 0x1fffffff) * nWords_00),nWords_00,
                 iVar3,iVar4);
      pSim0 = pSim0 + nWords_00;
    }
    local_34 = local_34 + 1;
  }
  iVar3 = Gia_ManObjNum(p);
  iVar4 = Gia_ManPoNum(p);
  pSim0 = Gia_ObjSim(p,iVar3 - iVar4);
  local_34 = 0;
  while( true ) {
    iVar3 = Gia_ManPoNum(p);
    bVar6 = false;
    if (local_34 < iVar3) {
      pSim = (word *)Gia_ManCo(p,local_34);
      bVar6 = (Gia_Obj_t *)pSim != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pwVar5 = Gia_ObjSimObj(p,(Gia_Obj_t *)pSim);
    if (pSim0 != pwVar5) {
      __assert_fail("pSim == Gia_ObjSimObj( p, pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                    ,0x118,"void Ssc_GiaSimRound(Gia_Man_t *)");
    }
    wVar2 = *pSim;
    iVar3 = Gia_ObjFaninC0((Gia_Obj_t *)pSim);
    Ssc_SimDup(pSim0,pSim0 + -(long)(int)(((uint)wVar2 & 0x1fffffff) * nWords_00),nWords_00,iVar3);
    pSim0 = pSim0 + nWords_00;
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void Ssc_GiaSimRound( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    word * pSim, * pSim0, * pSim1;
    int i, nWords = Gia_ObjSimWords(p);
    Ssc_GiaResetSimInfo( p );
    assert( nWords == Vec_WrdSize(p->vSims) / Gia_ManObjNum(p) );
    // constant node
    Ssc_SimConst( Gia_ObjSim(p, 0), nWords, 0 );
    // primary inputs
    pSim = Gia_ObjSim( p, 1 );
    pSim0 = Gia_ObjSimPi( p, 0 );
    Gia_ManForEachCi( p, pObj, i )
    {
        assert( pSim == Gia_ObjSimObj( p, pObj ) );
        Ssc_SimDup( pSim, pSim0, nWords, 0 );
        pSim += nWords;
        pSim0 += nWords;
    }
    // intermediate nodes
    pSim = Gia_ObjSim( p, 1+Gia_ManCiNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        assert( pSim == Gia_ObjSim( p, i ) );
        pSim0 = pSim - pObj->iDiff0 * nWords;
        pSim1 = pSim - pObj->iDiff1 * nWords;
        Ssc_SimAnd( pSim, pSim0, pSim1, nWords, Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj) );
        pSim += nWords;
    }
    // primary outputs
    pSim = Gia_ObjSim( p, Gia_ManObjNum(p) - Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        assert( pSim == Gia_ObjSimObj( p, pObj ) );
        pSim0 = pSim - pObj->iDiff0 * nWords;
        Ssc_SimDup( pSim, pSim0, nWords, Gia_ObjFaninC0(pObj) );
//        Extra_PrintBinary( stdout, pSim, 64 ), printf( "\n" );
        pSim += nWords;
    }
}